

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *__s;
  byte in_DIL;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  string c;
  char *in_stack_ffffffffffffff18;
  bool local_dd;
  bool local_db;
  string *suffix;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar4;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_99;
  string local_98 [37];
  byte local_73;
  byte local_72;
  undefined1 local_71 [40];
  undefined1 local_49;
  char *local_48;
  undefined8 local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  byte local_2;
  bool local_1;
  
  local_2 = in_DIL & 1;
  this = &local_28;
  std::__cxx11::string::string((string *)this,(string *)FLAGS_gtest_color_abi_cxx11_);
  local_30 = std::__cxx11::string::c_str();
  bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x154642);
  if (bVar2) {
    __s = posix::GetEnv((char *)0x154661);
    local_72 = 0;
    local_73 = 0;
    bVar1 = false;
    bVar2 = false;
    uVar5 = false;
    uVar4 = uVar5;
    local_48 = __s;
    if (__s != (char *)0x0) {
      bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x1546b5);
      uVar4 = true;
      if (!bVar3) {
        bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x1546da);
        uVar4 = true;
        if (!bVar3) {
          bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x1546ff);
          uVar4 = true;
          if (!bVar3) {
            bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x154724);
            uVar4 = true;
            if (!bVar3) {
              bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x154749);
              uVar4 = true;
              if (!bVar3) {
                bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x15476e);
                uVar4 = true;
                if (!bVar3) {
                  bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x154793);
                  uVar4 = true;
                  if (!bVar3) {
                    bVar3 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x1547b8);
                    uVar4 = true;
                    if (!bVar3) {
                      suffix = (string *)local_71;
                      std::allocator<char>::allocator();
                      local_72 = 1;
                      std::__cxx11::string::string<std::allocator<char>>
                                (this,__s,(allocator<char> *)
                                          CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff40)))
                      ;
                      local_73 = 1;
                      std::allocator<char>::allocator();
                      bVar1 = true;
                      std::__cxx11::string::string<std::allocator<char>>
                                (this,__s,(allocator<char> *)
                                          CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff40)))
                      ;
                      bVar2 = true;
                      uVar4 = String::EndsWithCaseInsensitive
                                        ((string *)
                                         CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff40)),
                                         suffix);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string(local_98);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_99);
    }
    if ((local_73 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_71 + 1));
    }
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_71);
    }
    local_db = false;
    if ((local_2 & 1) != 0) {
      local_db = (bool)uVar4;
    }
    local_1 = local_db;
    local_49 = uVar4;
  }
  else {
    bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x1549b5);
    local_dd = true;
    if (!bVar2) {
      bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x1549e0);
      local_dd = true;
      if (!bVar2) {
        bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x154a0b);
        local_dd = true;
        if (!bVar2) {
          local_dd = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x154a36);
        }
      }
    }
    local_1 = local_dd;
  }
  std::__cxx11::string::~string((string *)&local_28);
  return (bool)(local_1 & 1);
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}